

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O2

void __thiscall Qentem::StringStream<char>::expand(StringStream<char> *this,SizeT new_capacity)

{
  char *from;
  
  from = this->storage_;
  allocate(this,new_capacity << 2);
  Memory::Copy<unsigned_int>(this->storage_,from,this->length_);
  Memory::Deallocate(from);
  return;
}

Assistant:

void expand(const SizeT new_capacity) {
        constexpr SizeT size = sizeof(Char_T);
        Char_T         *str  = Storage();

        allocate(new_capacity * SizeT{4});

        Memory::Copy(Storage(), str, (Length() * size));
        Memory::Deallocate(str);
    }